

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O1

int uv_tcp_getpeername(uv_tcp_t *handle,sockaddr *name,int *namelen)

{
  int iVar1;
  int *piVar2;
  socklen_t socklen;
  socklen_t local_c;
  
  if (handle->delayed_error != 0) {
    return handle->delayed_error;
  }
  iVar1 = (handle->io_watcher).fd;
  if (-1 < iVar1) {
    local_c = *namelen;
    iVar1 = getpeername(iVar1,(sockaddr *)name,&local_c);
    if (iVar1 == 0) {
      *namelen = local_c;
      iVar1 = 0;
    }
    else {
      piVar2 = __errno_location();
      iVar1 = -*piVar2;
    }
    return iVar1;
  }
  return -0x16;
}

Assistant:

int uv_tcp_getpeername(const uv_tcp_t* handle,
                       struct sockaddr* name,
                       int* namelen) {
  socklen_t socklen;

  if (handle->delayed_error)
    return handle->delayed_error;

  if (uv__stream_fd(handle) < 0)
    return -EINVAL;  /* FIXME(bnoordhuis) -EBADF */

  /* sizeof(socklen_t) != sizeof(int) on some systems. */
  socklen = (socklen_t) *namelen;

  if (getpeername(uv__stream_fd(handle), name, &socklen))
    return -errno;

  *namelen = (int) socklen;
  return 0;
}